

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.c
# Opt level: O2

void InitShader(uint32_t *shaderId,char *vertexSrc,char *fragmentSrc)

{
  GLint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  char *__s;
  char *__ptr;
  size_t sStack_60;
  GLint isLinked;
  GLint isCompiled;
  GLuint *local_48;
  GLchar *source;
  GLint maxLength_2;
  
  local_48 = shaderId;
  GVar2 = (*glad_glCreateShader)(0x8b31);
  source = vertexSrc;
  (*glad_glShaderSource)(GVar2,1,&source,(GLint *)0x0);
  (*glad_glCompileShader)(GVar2);
  isCompiled = 0;
  (*glad_glGetShaderiv)(GVar2,0x8b81,&isCompiled);
  if (isCompiled == 0) {
    isLinked = 0;
    (*glad_glGetShaderiv)(GVar2,0x8b84,&isLinked);
    GVar1 = isLinked;
    __s = (char *)malloc((long)isLinked);
    (*glad_glGetShaderInfoLog)(GVar2,GVar1,&isLinked,__s);
    (*glad_glDeleteShader)(GVar2);
    fputs(__s,_stderr);
    __ptr = "Vertex shader compilation failed!\n";
    sStack_60 = 0x22;
  }
  else {
    GVar3 = (*glad_glCreateShader)(0x8b30);
    source = fragmentSrc;
    (*glad_glShaderSource)(GVar3,1,&source,(GLint *)0x0);
    (*glad_glCompileShader)(GVar3);
    (*glad_glGetShaderiv)(GVar3,0x8b81,&isCompiled);
    if (isCompiled == 0) {
      isLinked = 0;
      (*glad_glGetShaderiv)(GVar3,0x8b84,&isLinked);
      GVar1 = isLinked;
      __s = (char *)malloc((long)isLinked);
      (*glad_glGetShaderInfoLog)(GVar3,GVar1,&isLinked,__s);
      (*glad_glDeleteShader)(GVar3);
      (*glad_glDeleteShader)(GVar2);
      fputs(__s,_stderr);
      __ptr = "Fragment shader compilation failed!\n";
      sStack_60 = 0x24;
    }
    else {
      GVar4 = (*glad_glCreateProgram)();
      *local_48 = GVar4;
      (*glad_glAttachShader)(GVar4,GVar2);
      (*glad_glAttachShader)(GVar4,GVar3);
      (*glad_glLinkProgram)(GVar4);
      isLinked = 0;
      (*glad_glGetProgramiv)(GVar4,0x8b82,&isLinked);
      if (isLinked != 0) {
        (*glad_glDetachShader)(GVar4,GVar2);
        (*glad_glDetachShader)(GVar4,GVar3);
        return;
      }
      maxLength_2 = 0;
      (*glad_glGetProgramiv)(GVar4,0x8b84,&maxLength_2);
      GVar1 = maxLength_2;
      __s = (char *)malloc((long)maxLength_2);
      (*glad_glGetProgramInfoLog)(GVar4,GVar1,&maxLength_2,__s);
      (*glad_glDeleteProgram)(GVar4);
      (*glad_glDeleteShader)(GVar2);
      (*glad_glDeleteShader)(GVar3);
      fputs(__s,_stderr);
      __ptr = "Shader linking failed!\n";
      sStack_60 = 0x17;
    }
  }
  fwrite(__ptr,sStack_60,1,_stderr);
  free(__s);
  return;
}

Assistant:

void InitShader(uint32_t * shaderId, const char* vertexSrc, const char* fragmentSrc) {
    // Create an empty vertex shader handle
    GLuint vertexShader = glCreateShader(GL_VERTEX_SHADER);

// Send the vertex shader source code to GL
// Note that std::string's .c_str is NULL character terminated.
    const GLchar* source = vertexSrc;
    glShaderSource(vertexShader, 1, &source, 0);

// Compile the vertex shader
    glCompileShader(vertexShader);

    GLint isCompiled = 0;
    glGetShaderiv(vertexShader, GL_COMPILE_STATUS, &isCompiled);
    if (isCompiled == GL_FALSE) {
        GLint maxLength = 0;
        glGetShaderiv(vertexShader, GL_INFO_LOG_LENGTH, &maxLength);

        // The maxLength includes the NULL character
        char * infoLog = malloc(sizeof(char) * maxLength);
        glGetShaderInfoLog(vertexShader, maxLength, &maxLength, infoLog);

        // We don't need the shader anymore.
        glDeleteShader(vertexShader);

        // Use the infoLog as you see fit.

        // In this simple program, we'll just leave
        fprintf(stderr, "%s", infoLog);
        fprintf(stderr, "Vertex shader compilation failed!\n");
        free(infoLog);
        assert(false);
        return;
    }

// Create an empty fragment shader handle
    GLuint fragmentShader = glCreateShader(GL_FRAGMENT_SHADER);

// Send the fragment shader source code to GL
// Note that std::string's .c_str is NULL character terminated.
    source = (const GLchar*) fragmentSrc;
    glShaderSource(fragmentShader, 1, &source, 0);

// Compile the fragment shader
    glCompileShader(fragmentShader);

    glGetShaderiv(fragmentShader, GL_COMPILE_STATUS, &isCompiled);
    if (isCompiled == GL_FALSE) {
        GLint maxLength = 0;
        glGetShaderiv(fragmentShader, GL_INFO_LOG_LENGTH, &maxLength);

        // The maxLength includes the NULL character
        char * infoLog = malloc(sizeof(char) * maxLength);
        glGetShaderInfoLog(fragmentShader, maxLength, &maxLength, infoLog);

        // We don't need the shader anymore.
        glDeleteShader(fragmentShader);
        // Either of them. Don't leak shaders.
        glDeleteShader(vertexShader);

        // Use the infoLog as you see fit.

        // In this simple program, we'll just leave
        fprintf(stderr, "%s", infoLog);
        fprintf(stderr, "Fragment shader compilation failed!\n");
        free(infoLog);
        assert(false);
        return;
    }

// Vertex and fragment shaders are successfully compiled.
// Now time to link them together into a program.
// Get a program object.
    *shaderId = glCreateProgram();
    GLuint program = *shaderId;

// Attach our shaders to our program
    glAttachShader(program, vertexShader);
    glAttachShader(program, fragmentShader);

// Link our program
    glLinkProgram(program);

// Note the different functions here: glGetProgram* instead of glGetShader*.
    GLint isLinked = 0;
    glGetProgramiv(program, GL_LINK_STATUS, (int*) &isLinked);
    if (isLinked == GL_FALSE) {
        GLint maxLength = 0;
        glGetProgramiv(program, GL_INFO_LOG_LENGTH, &maxLength);

        // The maxLength includes the NULL character
        char * infoLog = malloc(sizeof(char) * maxLength);
        glGetProgramInfoLog(program, maxLength, &maxLength, infoLog);

        // We don't need the program anymore.
        glDeleteProgram(program);
        // Don't leak shaders either.
        glDeleteShader(vertexShader);
        glDeleteShader(fragmentShader);

        // Use the infoLog as you see fit.

        // In this simple program, we'll just leave
        fprintf(stderr, "%s", infoLog);
        fprintf(stderr, "Shader linking failed!\n");
        free(infoLog);
        assert(false);
        return;
    }

// Always detach shaders after a successful link.
    glDetachShader(program, vertexShader);
    glDetachShader(program, fragmentShader);
}